

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O1

Result<wasm::Tag_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTagDecl
          (Result<wasm::Tag_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  Tag *pTVar4;
  long *plVar5;
  uint uVar6;
  char *pcVar7;
  ulong *puVar8;
  ulong uVar9;
  uint __len;
  string_view sVar10;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  ImportNames *local_60;
  Err local_58;
  _Head_base<0UL,_wasm::Tag_*,_false> local_38;
  __single_object t;
  
  local_60 = importNames;
  local_38._M_head_impl = (Tag *)operator_new(0x40);
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  ((local_38._M_head_impl)->type).id = 0;
  ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
       (char *)0x0;
  *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
  ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->type).id = 0x10;
  if (name.super_IString.str._M_str == (char *)0x0) {
    uVar2 = this->tagCounter;
    this->tagCounter = uVar2 + 1;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00b8da58;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00b8da58;
        }
        if (uVar6 < 10000) goto LAB_00b8da58;
        uVar9 = uVar9 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_00b8da58:
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct((ulong)local_80,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_80[0]),__len,__val);
    pcVar7 = "eimport$";
    if (local_60 == (ImportNames *)0x0) {
      pcVar7 = "tag$";
    }
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,(ulong)pcVar7);
    paVar1 = &local_58.msg.field_2;
    puVar8 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_58.msg.field_2._M_allocated_capacity = *puVar8;
      local_58.msg.field_2._8_8_ = plVar5[3];
      local_58.msg._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_58.msg.field_2._M_allocated_capacity = *puVar8;
      local_58.msg._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_58.msg._M_string_length = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    sVar10._M_str = (char *)0x0;
    sVar10._M_len = (size_t)local_58.msg._M_dataplus._M_p;
    sVar10 = IString::interned((IString *)local_58.msg._M_string_length,sVar10,SUB81(puVar8,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.msg._M_dataplus._M_p,local_58.msg.field_2._M_allocated_capacity + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    sVar10 = (string_view)Names::getValidTagName(this->wasm,(Name)sVar10);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar10;
  }
  else {
    pTVar4 = Module::getTagOrNull(this->wasm,name);
    if (pTVar4 != (Tag *)0x0) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"repeated tag name","");
      Lexer::err(&local_58,&this->in,(ulong)pos,&local_a0);
      puVar8 = (ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Tag_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> = puVar8;
      paVar1 = &local_58.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.msg._M_dataplus._M_p == paVar1) {
        *puVar8 = local_58.msg.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x18) =
             local_58.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> = local_58.msg._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x10) =
             local_58.msg.field_2._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 8) =
           local_58.msg._M_string_length;
      local_58.msg._M_string_length = 0;
      local_58.msg.field_2._M_allocated_capacity =
           local_58.msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x20) = '\x01';
      local_58.msg._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00b8db8c;
    }
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         name.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         name.super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
  }
  if (local_60 != (ImportNames *)0x0) {
    pcVar7 = (local_60->mod).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (local_60->mod).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar7;
    pcVar7 = (local_60->nm).super_IString.str._M_str;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (local_60->nm).super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar7;
  }
  pTVar4 = Module::addTag(this->wasm,
                          (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
  *(Tag **)&(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> = pTVar4;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x20) = '\0';
LAB_00b8db8c:
  if (local_38._M_head_impl != (Tag *)0x0) {
    operator_delete(local_38._M_head_impl,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Tag*>
ParseDeclsCtx::addTagDecl(Index pos, Name name, ImportNames* importNames) {
  auto t = std::make_unique<Tag>();
  if (name) {
    if (wasm.getTagOrNull(name)) {
      // TODO: if the existing tag is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated tag name");
    }
    t->setExplicitName(name);
  } else {
    name = (importNames ? "eimport$" : "tag$") + std::to_string(tagCounter++);
    name = Names::getValidTagName(wasm, name);
    t->name = name;
  }
  applyImportNames(*t, importNames);
  return wasm.addTag(std::move(t));
}